

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sup.c
# Opt level: O0

void supfind(errcxdef *ec,tokthdef *htab,voccxdef *voc,objnum *preinit,int warnlevel,int cf)

{
  long in_RDX;
  toktdef *tab;
  int err;
  objnum *in_stack_00000048;
  char *in_stack_00000050;
  toktdef *in_stack_00000058;
  errcxdef *in_stack_00000060;
  int in_stack_00000070;
  int in_stack_00000078;
  
  supfind1(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,ec._4_4_,
           (int *)htab,in_stack_00000070,in_stack_00000078);
  supfind1(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,ec._4_4_,
           (int *)htab,in_stack_00000070,in_stack_00000078);
  supfind1(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,ec._4_4_,
           (int *)htab,in_stack_00000070,in_stack_00000078);
  supfind1(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,ec._4_4_,
           (int *)htab,in_stack_00000070,in_stack_00000078);
  supfind1(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,ec._4_4_,
           (int *)htab,in_stack_00000070,in_stack_00000078);
  supfind1(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,ec._4_4_,
           (int *)htab,in_stack_00000070,in_stack_00000078);
  supfind1(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,ec._4_4_,
           (int *)htab,in_stack_00000070,in_stack_00000078);
  supfind1(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,ec._4_4_,
           (int *)htab,in_stack_00000070,in_stack_00000078);
  supfind1(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,ec._4_4_,
           (int *)htab,in_stack_00000070,in_stack_00000078);
  supfind1(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,ec._4_4_,
           (int *)htab,in_stack_00000070,in_stack_00000078);
  supfind1(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,ec._4_4_,
           (int *)htab,in_stack_00000070,in_stack_00000078);
  supfind1(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,ec._4_4_,
           (int *)htab,in_stack_00000070,in_stack_00000078);
  supfind1(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,ec._4_4_,
           (int *)htab,in_stack_00000070,in_stack_00000078);
  supfind1(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,ec._4_4_,
           (int *)htab,in_stack_00000070,in_stack_00000078);
  supfind1(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,ec._4_4_,
           (int *)htab,in_stack_00000070,in_stack_00000078);
  supfind1(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,ec._4_4_,
           (int *)htab,in_stack_00000070,in_stack_00000078);
  supfind1(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,ec._4_4_,
           (int *)htab,in_stack_00000070,in_stack_00000078);
  supfind1(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,ec._4_4_,
           (int *)htab,in_stack_00000070,in_stack_00000078);
  supfind1(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,ec._4_4_,
           (int *)htab,in_stack_00000070,in_stack_00000078);
  supfind1(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,ec._4_4_,
           (int *)htab,in_stack_00000070,in_stack_00000078);
  supfind1(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,ec._4_4_,
           (int *)htab,in_stack_00000070,in_stack_00000078);
  supfind1(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,ec._4_4_,
           (int *)htab,in_stack_00000070,in_stack_00000078);
  supfind1(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,ec._4_4_,
           (int *)htab,in_stack_00000070,in_stack_00000078);
  supfind1(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,ec._4_4_,
           (int *)htab,in_stack_00000070,in_stack_00000078);
  supfind1(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,ec._4_4_,
           (int *)htab,in_stack_00000070,in_stack_00000078);
  supfind1(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,ec._4_4_,
           (int *)htab,in_stack_00000070,in_stack_00000078);
  supfind1(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,ec._4_4_,
           (int *)htab,in_stack_00000070,in_stack_00000078);
  supfind1(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,ec._4_4_,
           (int *)htab,in_stack_00000070,in_stack_00000078);
  *(undefined2 *)(in_RDX + 0xf42) = *(undefined2 *)(in_RDX + 0xf40);
  return;
}

Assistant:

void supfind(errcxdef *ec, tokthdef *htab, voccxdef *voc,
             objnum *preinit, int warnlevel, int cf)
{
    int      err = 0;
    toktdef *tab = &htab->tokthsc;

    /* look up the required and optional symbols */
    supfind1(ec, tab, "Me", &voc->voccxme, TRUE, &err, warnlevel, cf);
    supfind1(ec, tab, "takeVerb", &voc->voccxvtk, TRUE, &err, warnlevel, cf);
    supfind1(ec, tab, "strObj", &voc->voccxstr, TRUE, &err, warnlevel, cf);
    supfind1(ec, tab, "numObj", &voc->voccxnum, TRUE, &err, warnlevel, cf);
    supfind1(ec, tab, "pardon", &voc->voccxprd, TRUE, &err, warnlevel, cf);
    supfind1(ec, tab, "againVerb", &voc->voccxvag, TRUE, &err, warnlevel, cf);
    supfind1(ec, tab, "init", &voc->voccxini, TRUE, &err, warnlevel, cf);
    supfind1(ec, tab, "preinit", preinit, FALSE, &err, warnlevel, cf);
    supfind1(ec, tab, "preparse", &voc->voccxpre, FALSE, &err, warnlevel, cf);
    supfind1(ec, tab, "preparseExt", &voc->voccxpre2, FALSE, &err,
             warnlevel, cf);
    supfind1(ec, tab, "parseError", &voc->voccxper, FALSE, &err, warnlevel,
             cf);
    supfind1(ec, tab, "commandPrompt", &voc->voccxprom, FALSE, &err,
             warnlevel, cf);
    supfind1(ec, tab, "parseDisambig", &voc->voccxpdis, FALSE, &err,
             warnlevel, cf);
    supfind1(ec, tab, "parseError2", &voc->voccxper2, FALSE, &err, warnlevel,
             cf);
    supfind1(ec, tab, "parseDefault", &voc->voccxpdef, FALSE, &err, warnlevel,
             cf);
    supfind1(ec, tab, "parseDefaultExt", &voc->voccxpdef2, FALSE, &err,
             warnlevel, cf);
    supfind1(ec, tab, "parseAskobj", &voc->voccxpask, FALSE, &err, warnlevel,
             cf);
    supfind1(ec, tab, "preparseCmd", &voc->voccxppc, FALSE, &err, warnlevel,
             cf);
    supfind1(ec, tab, "parseAskobjActor", &voc->voccxpask2, FALSE,
             &err, warnlevel, cf);
    supfind1(ec, tab, "parseAskobjIndirect", &voc->voccxpask3, FALSE,
             &err, warnlevel, cf);
    supfind1(ec, tab, "parseErrorParam", &voc->voccxperp, FALSE, &err,
             warnlevel, cf);
    supfind1(ec, tab, "commandAfterRead", &voc->voccxpostprom, FALSE,
             &err, warnlevel, cf);
    supfind1(ec, tab, "initRestore", &voc->voccxinitrestore, FALSE,
             &err, warnlevel, cf);
    supfind1(ec, tab, "parseUnknownVerb", &voc->voccxpuv, FALSE,
             &err, warnlevel, cf);
    supfind1(ec, tab, "parseNounPhrase", &voc->voccxpnp, FALSE,
             &err, warnlevel, cf);
    supfind1(ec, tab, "postAction", &voc->voccxpostact, FALSE,
             &err, warnlevel, cf);
    supfind1(ec, tab, "endCommand", &voc->voccxendcmd, FALSE,
             &err, warnlevel, cf);
    supfind1(ec, tab, "preCommand", &voc->voccxprecmd, FALSE,
             &err, warnlevel, cf);

    /* "Me" is always the initial Me object */
    voc->voccxme_init = voc->voccxme;

    /* if we encountered any errors, signal the problem */
    if (err)
        errsig(ec, ERR_UNDEF);
}